

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O3

void __thiscall KDReports::Test::wrongTopElement(Test *this)

{
  QStringView QVar1;
  QStringView QVar2;
  QStringView QVar3;
  QStringView QVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  bool bVar7;
  char cVar8;
  byte bVar9;
  int iVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  ErrorDetails details;
  QArrayDataPointer<char16_t> local_c8;
  QArrayDataPointer<char16_t> local_b0;
  QFile file;
  Report report;
  QArrayDataPointer<char16_t> local_68;
  char *local_48;
  QStringView local_40;
  
  local_c8.d = (Data *)0x110f63;
  QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_b0,(char **)&local_c8)
  ;
  QVar11.m_data = (storage_type *)local_b0.d;
  QVar11.m_size = (qsizetype)&local_68;
  QString::fromUtf8(QVar11);
  _report = local_68.d;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QFile::QFile(&file,(QString *)&report);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&report);
  bVar7 = (bool)QFile::open(&file,1);
  cVar8 = QTest::qVerify(bVar7,"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0xd7);
  if (cVar8 != '\0') {
    KDReports::Report::Report(&report,(QObject *)0x0);
    KDReports::ErrorDetails::ErrorDetails(&details);
    bVar9 = KDReports::Report::loadFromXML((QIODevice *)&report,(ErrorDetails *)&file);
    cVar8 = QTest::qVerify((bool)(bVar9 ^ 1),"!report.loadFromXML(&file, &details)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0xda);
    if (cVar8 != '\0') {
      iVar10 = KDReports::ErrorDetails::line();
      cVar8 = QTest::qCompare(iVar10,-1,"details.line()","-1",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                              ,0xdb);
      if (cVar8 != '\0') {
        iVar10 = KDReports::ErrorDetails::column();
        cVar8 = QTest::qCompare(iVar10,-1,"details.column()","-1",
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                ,0xdc);
        if (cVar8 != '\0') {
          KDReports::ErrorDetails::driverMessage();
          local_48 = "Expected \"<report>\" as the topmost element, but found \"<XreportX>\"";
          QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&local_40,&local_48);
          QVar12.m_data = (storage_type *)local_40.m_size;
          QVar12.m_size = (qsizetype)&local_68;
          QString::fromUtf8(QVar12);
          qVar6 = local_68.size;
          pcVar5 = local_68.ptr;
          local_c8.d = local_68.d;
          local_68.d = (Data *)0x0;
          local_c8.ptr = local_68.ptr;
          local_68.ptr = (char16_t *)0x0;
          local_68.size = 0;
          local_c8.size = qVar6;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
          QStringView::QStringView<QChar,_true>
                    ((QStringView *)&local_68,(QChar *)local_b0.ptr,local_b0.size);
          QStringView::QStringView<QChar,_true>(&local_40,(QChar *)pcVar5,qVar6);
          QVar1.m_data = local_68.ptr;
          QVar1.m_size = (qsizetype)local_68.d;
          QVar3.m_data = local_40.m_data;
          QVar3.m_size = local_40.m_size;
          cVar8 = QTest::qCompare(QVar1,QVar3,"details.driverMessage()",
                                  "QString(\"Expected \\\"<report>\\\" as the topmost element, but found \\\"<XreportX>\\\"\")"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0xdd);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
          if (cVar8 != '\0') {
            KDReports::ErrorDetails::message();
            local_48 = "Expected \"<report>\" as the topmost element, but found \"<XreportX>\"";
            QByteArrayView::QByteArrayView<const_char_*,_true>
                      ((QByteArrayView *)&local_40,&local_48);
            QVar13.m_data = (storage_type *)local_40.m_size;
            QVar13.m_size = (qsizetype)&local_68;
            QString::fromUtf8(QVar13);
            qVar6 = local_68.size;
            pcVar5 = local_68.ptr;
            local_c8.d = local_68.d;
            local_68.d = (Data *)0x0;
            local_c8.ptr = local_68.ptr;
            local_68.ptr = (char16_t *)0x0;
            local_68.size = 0;
            local_c8.size = qVar6;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
            QStringView::QStringView<QChar,_true>
                      ((QStringView *)&local_68,(QChar *)local_b0.ptr,local_b0.size);
            QStringView::QStringView<QChar,_true>(&local_40,(QChar *)pcVar5,qVar6);
            QVar2.m_data = local_68.ptr;
            QVar2.m_size = (qsizetype)local_68.d;
            QVar4.m_data = local_40.m_data;
            QVar4.m_size = local_40.m_size;
            QTest::qCompare(QVar2,QVar4,"details.message()",
                            "QString(\"Expected \\\"<report>\\\" as the topmost element, but found \\\"<XreportX>\\\"\")"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                            ,0xde);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
          }
        }
      }
    }
    KDReports::ErrorDetails::~ErrorDetails(&details);
    KDReports::Report::~Report(&report);
  }
  QFile::~QFile(&file);
  return;
}

Assistant:

void wrongTopElement()
    {
        QFile file(":/wrongTopElement.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        Report report;
        KDReports::ErrorDetails details;
        QVERIFY(!report.loadFromXML(&file, &details));
        QCOMPARE(details.line(), -1);
        QCOMPARE(details.column(), -1);
        QCOMPARE(details.driverMessage(), QString("Expected \"<report>\" as the topmost element, but found \"<XreportX>\""));
        QCOMPARE(details.message(), QString("Expected \"<report>\" as the topmost element, but found \"<XreportX>\""));
    }